

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::Read
          (NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *this,
          TextReader<fmt::Locale> *bound_reader)

{
  byte bVar1;
  NLHeader *pNVar2;
  byte *loc;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  TextReader<fmt::Locale> *pTVar8;
  bool bVar9;
  undefined1 local_58 [16];
  ArgList local_40;
  
  bVar9 = bound_reader == (TextReader<fmt::Locale> *)0x0;
  pNVar2 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  do {
    while( true ) {
      pTVar8 = this->reader_;
      loc = (byte *)(pTVar8->super_ReaderBase).ptr_;
      (pTVar8->super_ReaderBase).token_ = (char *)loc;
      (pTVar8->super_ReaderBase).ptr_ = (char *)(loc + 1);
      bVar1 = *loc;
      if (bVar1 < 0x62) break;
      if (bVar1 < 0x6b) {
        if (bVar1 == 0x62) {
          if (bVar9) {
            NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
            ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::VarHandler>
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this);
            bVar9 = false;
            if ((this->flags_ & 1) != 0) {
              return;
            }
          }
          else {
            if (bound_reader == (TextReader<fmt::Locale> *)0x0) {
              local_58 = (undefined1  [16])0x0;
              local_40.types_ = 0;
              local_40.field_1.values_ = (Value *)local_58;
              TextReader<fmt::Locale>::DoReportError
                        (pTVar8,(char *)loc,(CStringRef)0x26348f,&local_40);
              pcVar4 = pcRam0000000000000018;
              pcVar3 = pcRam0000000000000008;
              pcVar7 = _DAT_00000000;
              pTVar8 = this->reader_;
              (pTVar8->super_ReaderBase).end_ = _DAT_00000010;
              (pTVar8->super_ReaderBase).token_ = pcVar4;
              (pTVar8->super_ReaderBase).ptr_ = pcVar7;
              (pTVar8->super_ReaderBase).start_ = pcVar3;
              std::__cxx11::string::_M_assign((string *)&(pTVar8->super_ReaderBase).name_);
              pTVar8->line_ = _DAT_00000048;
              pcVar7 = _DAT_00000040;
            }
            else {
              pcVar7 = (bound_reader->super_ReaderBase).ptr_;
              pcVar3 = (bound_reader->super_ReaderBase).start_;
              pcVar4 = (bound_reader->super_ReaderBase).token_;
              (pTVar8->super_ReaderBase).end_ = (bound_reader->super_ReaderBase).end_;
              (pTVar8->super_ReaderBase).token_ = pcVar4;
              (pTVar8->super_ReaderBase).ptr_ = pcVar7;
              (pTVar8->super_ReaderBase).start_ = pcVar3;
              std::__cxx11::string::_M_assign((string *)&(pTVar8->super_ReaderBase).name_);
              pTVar8->line_ = bound_reader->line_;
              pcVar7 = bound_reader->line_start_;
            }
            pTVar8->line_start_ = pcVar7;
            bound_reader = (TextReader<fmt::Locale> *)0x0;
          }
        }
        else {
          if (bVar1 != 100) goto switchD_001d09b3_caseD_44;
          NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
          ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::AlgebraicConHandler>
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this);
        }
      }
      else if (bVar1 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar1 == 0x72) {
        NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
        ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::AlgebraicConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this);
      }
      else {
        if (bVar1 != 0x78) goto switchD_001d09b3_caseD_44;
        NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
        ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this);
      }
    }
    switch(bVar1) {
    case 0x43:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons);
      goto LAB_001d0b11;
    case 0x46:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      uVar5 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      if (1 < uVar5) {
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)local_58;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x2668c3,
                   &local_40);
      }
      TextReader<fmt::Locale>::ReadInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadName(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      break;
    case 0x47:
      NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::ObjHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::AlgebraicConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      ReadLogicalExpr(this);
      break;
    case 0x4f:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
LAB_001d0b11:
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      pTVar8 = this->reader_;
      pcVar7 = (pTVar8->super_ReaderBase).ptr_;
      (pTVar8->super_ReaderBase).token_ = pcVar7;
      (pTVar8->super_ReaderBase).ptr_ = pcVar7 + 1;
      ReadNumericExpr(this,*pcVar7,true);
      break;
    case 0x53:
      uVar5 = TextReader<fmt::Locale>::ReadUInt<int>(pTVar8);
      if (7 < (int)uVar5) {
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)local_58;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x266ffe,
                   &local_40);
      }
      switch(uVar5 & 3) {
      case 0:
        NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this,uVar5);
        break;
      case 1:
        NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::ConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this,uVar5);
        break;
      case 2:
        NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::ObjHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this,uVar5);
        break;
      case 3:
        NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::ProblemHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this,uVar5);
      }
      break;
    case 0x56:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
               this->num_vars_and_exprs_);
      iVar6 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      if (iVar6 != 0) {
        NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter>::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<int>,int>::LinearExprHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,VarCounter> *)this,iVar6);
      }
      pTVar8 = this->reader_;
      pcVar7 = (pTVar8->super_ReaderBase).ptr_;
      (pTVar8->super_ReaderBase).token_ = pcVar7;
      (pTVar8->super_ReaderBase).ptr_ = pcVar7 + 1;
      ReadNumericExpr(this,*pcVar7,false);
      break;
    default:
      if ((bVar1 == 0) && ((byte *)(pTVar8->super_ReaderBase).end_ == loc)) {
        if (!bVar9) {
          return;
        }
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)local_58;
        TextReader<fmt::Locale>::DoReportError(pTVar8,(char *)loc,(CStringRef)0x263363,&local_40);
        return;
      }
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_001d09b3_caseD_44:
      local_58 = (undefined1  [16])0x0;
      local_40.types_ = 0;
      local_40.field_1.values_ = (Value *)local_58;
      TextReader<fmt::Locale>::DoReportError(pTVar8,(char *)loc,(CStringRef)0x26738a,&local_40);
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}